

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

bool poll_process_memory_usage(pid_t pid,ProcessStats *stats)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  bool bVar4;
  longlong values [3];
  char path [1024];
  undefined1 auStack_448 [8];
  long local_440;
  long local_438 [2];
  char local_428 [1032];
  
  bVar4 = false;
  snprintf(local_428,0x400,"/proc/%d/statm",pid);
  __stream = fopen(local_428,"r");
  if (__stream != (FILE *)0x0) {
    bVar4 = false;
    iVar1 = __isoc99_fscanf(__stream,"%lld %lld %lld",auStack_448,&local_440,local_438);
    fclose(__stream);
    if (iVar1 == 3) {
      iVar1 = getpagesize();
      local_440 = local_440 * iVar1;
      lVar3 = local_440 + 0xfffff;
      if (-1 < local_440) {
        lVar3 = local_440;
      }
      lVar3 = lVar3 >> 0x14;
      local_438[0] = iVar1 * local_438[0];
      lVar2 = local_438[0] + 0xfffff;
      if (-1 < local_438[0]) {
        lVar2 = local_438[0];
      }
      lVar2 = lVar2 >> 0x14;
      if (0xfffffffe < lVar3) {
        lVar3 = 0xffffffff;
      }
      if (0xfffffffe < lVar2) {
        lVar2 = 0xffffffff;
      }
      stats->resident_mib = (uint32_t)lVar3;
      stats->shared_mib = (uint32_t)lVar2;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

static bool poll_process_memory_usage(pid_t pid, ExternalReplayer::ProcessStats &stats)
{
	long long values[3];
	char path[1024];
	snprintf(path, sizeof(path), "/proc/%d/statm", pid);
	FILE *file = fopen(path, "r");
	if (!file)
		return false;

	if (fscanf(file, "%lld %lld %lld",
	           &values[0], &values[1], &values[2]) != 3)
	{
		fclose(file);
		return false;
	}
	fclose(file);

	int64_t resident = (values[1] * getpagesize()) / (1024 * 1024);
	int64_t shared = (values[2] * getpagesize()) / (1024 * 1024);
	if (resident > UINT32_MAX)
		resident = UINT32_MAX;
	if (shared > UINT32_MAX)
		shared = UINT32_MAX;

	stats.resident_mib = resident;
	stats.shared_mib = shared;
	return true;
}